

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCreateTable(Btree *p,Pgno *piTable,int flags)

{
  int *piVar1;
  BtShared *pBt;
  uint uVar2;
  Pgno iFreePage;
  uint uVar3;
  BtCursor *pBVar4;
  int iVar5;
  DbPage *pPg;
  uint nearby;
  MemPage *pMVar6;
  long in_FS_OFFSET;
  u8 eType;
  MemPage *pPageMove;
  Pgno pgnoMove;
  Pgno pgnoRoot;
  MemPage *pRoot;
  Pgno local_60;
  u8 local_59;
  MemPage *local_58;
  Pgno local_4c;
  int local_48;
  u32 local_44;
  MemPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBt = p->pBt;
  local_40 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
  local_44 = 0xaaaaaaaa;
  if (pBt->autoVacuum == '\0') {
    iVar5 = allocateBtreePage(pBt,&local_40,&local_44,1,'\0');
    pMVar6 = local_40;
    local_48 = iVar5;
    if (iVar5 != 0) goto LAB_0014fbfb;
LAB_0014fb34:
    zeroPage(pMVar6,(flags & 1U) * 3 + 10);
    if (pMVar6->pDbPage != (DbPage *)0x0) {
      sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
    }
    *piTable = local_44;
    iVar5 = 0;
    goto LAB_0014fbfb;
  }
  local_4c = 0xaaaaaaaa;
  local_58 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
  for (pBVar4 = pBt->pCursor; pBVar4 != (BtCursor *)0x0; pBVar4 = pBVar4->pNext) {
    pBVar4->curFlags = pBVar4->curFlags & 0xfb;
  }
  sqlite3BtreeGetMeta(p,4,&local_44);
  if (pBt->nPage < local_44) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13b8b,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    iVar5 = 0xb;
    goto LAB_0014fbfb;
  }
  do {
    uVar2 = local_44;
    nearby = uVar2 + 1;
    uVar3 = 0;
    if (1 < nearby) {
      iVar5 = (uVar2 - 1) - (uVar2 - 1) % (pBt->usableSize / 5 + 1);
      uVar3 = iVar5 + (uint)(iVar5 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
    }
    local_44 = nearby;
  } while ((nearby == uVar3) || (uVar2 == (uint)sqlite3PendingByte / pBt->pageSize));
  local_48 = allocateBtreePage(pBt,&local_58,&local_4c,nearby,'\x01');
  iFreePage = local_4c;
  iVar5 = local_48;
  if (local_48 != 0) goto LAB_0014fbfb;
  if (local_4c == nearby) {
    local_40 = local_58;
    pMVar6 = local_58;
LAB_0014fc47:
    ptrmapPut(pBt,nearby,'\x01',0,&local_48);
    if ((local_48 == 0) && (local_48 = sqlite3BtreeUpdateMeta(p,4,nearby), local_48 == 0))
    goto LAB_0014fb34;
    iVar5 = local_48;
    if (pMVar6 == (MemPage *)0x0) goto LAB_0014fbfb;
    pPg = pMVar6->pDbPage;
  }
  else {
    local_59 = '\0';
    local_60 = 0;
    if (pBt->pCursor == (BtCursor *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0);
    }
    if (local_58 != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_58->pDbPage);
    }
    if ((iVar5 != 0) || (iVar5 = btreeGetPage(pBt,nearby,&local_40,0), iVar5 != 0))
    goto LAB_0014fbfb;
    iVar5 = ptrmapGet(pBt,nearby,&local_59,&local_60);
    pMVar6 = local_40;
    if ((byte)(local_59 - 1) < 2) {
      iVar5 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13bbb,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
LAB_0014fd5c:
      pMVar6 = local_40;
      if (local_40 == (MemPage *)0x0) goto LAB_0014fbfb;
    }
    else {
      if (iVar5 != 0) goto LAB_0014fd5c;
      iVar5 = relocatePage(pBt,local_40,local_59,local_60,iFreePage,0);
      if (pMVar6 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
      }
      if ((iVar5 != 0) ||
         (iVar5 = btreeGetPage(pBt,nearby,&local_40,0), pMVar6 = local_40, iVar5 != 0))
      goto LAB_0014fbfb;
      iVar5 = sqlite3PagerWrite(local_40->pDbPage);
      local_48 = iVar5;
      if (iVar5 == 0) goto LAB_0014fc47;
    }
    pPg = pMVar6->pDbPage;
  }
  sqlite3PagerUnrefNotNull(pPg);
LAB_0014fbfb:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, Pgno *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}